

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  freeexp(fs,e);
  luaK_reserveregs(fs,1);
  exp2reg(fs,e,fs->freereg - 1);
  return;
}

Assistant:

void luaK_exp2nextreg(FuncState *fs, expdesc *e) {
    luaK_dischargevars(fs, e);
    freeexp(fs, e);
    luaK_reserveregs(fs, 1);
    exp2reg(fs, e, fs->freereg - 1);
}